

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddLinkExtension(cmComputeLinkInformation *this,char *e,LinkType type)

{
  char *pcVar1;
  allocator local_a1;
  value_type local_a0;
  allocator local_79;
  value_type local_78;
  allocator local_41;
  value_type local_40;
  LinkType local_1c;
  char *pcStack_18;
  LinkType type_local;
  char *e_local;
  cmComputeLinkInformation *this_local;
  
  if ((e != (char *)0x0) && (*e != '\0')) {
    local_1c = type;
    pcStack_18 = e;
    e_local = (char *)this;
    if (type == LinkStatic) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,e,&local_41);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->StaticLinkExtensions,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    pcVar1 = pcStack_18;
    if (local_1c == LinkShared) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->SharedLinkExtensions,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    pcVar1 = pcStack_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->LinkExtensions,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLinkExtension(const char* e, LinkType type)
{
  if (e && *e) {
    if (type == LinkStatic) {
      this->StaticLinkExtensions.push_back(e);
    }
    if (type == LinkShared) {
      this->SharedLinkExtensions.push_back(e);
    }
    this->LinkExtensions.push_back(e);
  }
}